

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O1

void SdlCallback(void *pUnused,Uint8 *pStream,int Len)

{
  int *piVar1;
  int iVar2;
  CSample *pCVar3;
  uint uVar4;
  float fVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  uint uVar9;
  uint uVar11;
  short *psVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  CVoice *v;
  uint i;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int iVar10;
  
  iVar10 = Len + 3;
  if (-1 < Len) {
    iVar10 = Len;
  }
  uVar9 = iVar10 >> 2;
  mem_zero(m_pMixBuffer,m_MaxFrames << 3);
  uVar6 = m_MaxFrames;
  uVar11 = m_MaxFrames;
  if (uVar9 < m_MaxFrames) {
    uVar11 = uVar9;
  }
  lock_wait(m_SoundLock);
  iVar10 = m_SoundVolume;
  lVar18 = 0;
  do {
    piVar7 = m_pMixBuffer;
    pCVar3 = m_aVoices[lVar18].m_pSample;
    if (pCVar3 != (CSample *)0x0) {
      iVar8 = pCVar3->m_Channels;
      uVar16 = pCVar3->m_NumFrames - m_aVoices[lVar18].m_Tick;
      psVar12 = pCVar3->m_pData + m_aVoices[lVar18].m_Tick * iVar8;
      uVar4 = uVar16;
      if (uVar11 < uVar16) {
        uVar4 = uVar11;
      }
      if ((m_aVoices[lVar18].m_Flags & 2) == 0) {
        iVar14 = (m_aVoices[lVar18].m_pChannel)->m_Vol;
        iVar17 = iVar14;
      }
      else {
        iVar14 = m_aVoices[lVar18].m_Y - m_CenterY;
        fVar20 = (float)(m_aVoices[lVar18].m_X - m_CenterX);
        fVar19 = fVar20 * fVar20 + (float)(iVar14 * iVar14);
        if (fVar19 < 0.0) {
          fVar19 = sqrtf(fVar19);
        }
        else {
          fVar19 = SQRT(fVar19);
        }
        fVar5 = m_MaxDistance;
        iVar14 = 0;
        if (0.0 <= fVar19) {
          iVar17 = 0;
          if (fVar19 < m_MaxDistance) {
            iVar14 = (m_aVoices[lVar18].m_pChannel)->m_Vol;
            fVar20 = 0.5 - (fVar20 / m_MaxDistance) * 0.5;
            if (fVar20 < 0.0) {
              fVar21 = sqrtf(fVar20);
            }
            else {
              fVar21 = SQRT(fVar20);
            }
            fVar20 = 1.0 - fVar20;
            if (fVar20 < 0.0) {
              fVar20 = sqrtf(fVar20);
            }
            else {
              fVar20 = SQRT(fVar20);
            }
            fVar19 = (1.0 - fVar19 / fVar5) * (float)iVar14;
            iVar14 = (int)(fVar21 * fVar19);
            iVar17 = (int)(fVar19 * fVar20);
          }
        }
        else {
          iVar17 = 0;
        }
      }
      if (uVar4 != 0) {
        iVar2 = m_aVoices[lVar18].m_Tick;
        uVar13 = uVar9;
        if (uVar6 < uVar9) {
          uVar13 = uVar6;
        }
        if (uVar16 <= uVar13) {
          uVar13 = uVar16;
        }
        lVar15 = 0;
        do {
          piVar1 = piVar7 + lVar15 * 2;
          *piVar1 = *piVar1 + *psVar12 * iVar14;
          piVar1 = piVar7 + lVar15 * 2 + 1;
          *piVar1 = *piVar1 + *(short *)((long)psVar12 + (ulong)((uint)((long)iVar8 != 1) * 2)) *
                              iVar17;
          lVar15 = lVar15 + 1;
          psVar12 = psVar12 + iVar8;
        } while (uVar13 != (uint)lVar15);
        m_aVoices[lVar18].m_Tick = iVar2 + uVar4;
      }
      if (m_aVoices[lVar18].m_Tick == (m_aVoices[lVar18].m_pSample)->m_NumFrames) {
        if ((m_aVoices[lVar18].m_Flags & 1) == 0) {
          m_aVoices[lVar18].m_pSample = (CSample *)0x0;
        }
        else {
          m_aVoices[lVar18].m_Tick = 0;
        }
      }
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x40);
  lock_unlock(m_SoundLock);
  piVar7 = m_pMixBuffer;
  if (uVar11 != 0) {
    iVar8 = 1;
    do {
      iVar14 = (piVar7[iVar8 + -1] * iVar10) / 0x65 >> 8;
      if (0x7ffe < iVar14) {
        iVar14 = 0x7fff;
      }
      if (iVar14 < -0x7fff) {
        iVar14 = -0x8000;
      }
      iVar17 = (piVar7[iVar8] * iVar10) / 0x65 >> 8;
      *(short *)(pStream + (long)(iVar8 + -1) * 2) = (short)iVar14;
      if (0x7ffe < iVar17) {
        iVar17 = 0x7fff;
      }
      if (iVar17 < -0x7fff) {
        iVar17 = -0x8000;
      }
      *(short *)(pStream + (long)iVar8 * 2) = (short)iVar17;
      iVar8 = iVar8 + 2;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

static void SdlCallback(void *pUnused, Uint8 *pStream, int Len)
{
	(void)pUnused;
	Mix((short *)pStream, Len/2/2);
}